

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::complete(Molecule *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  HBondDonor *donor_2;
  string bn2_1;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb2_1;
  AtomType *at2_1;
  string bn1_1;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb1_1;
  AtomType *at1_1;
  HBondDonor *donor_1;
  HBondDonor *donor;
  string bn2;
  string bn1;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb2;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb1;
  AtomType *at2;
  AtomType *at1;
  Atom *atom2_1;
  Atom *atom1_1;
  string bn;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  AtomType *at;
  BondIterator bi;
  Bond *bond;
  RigidBodyIterator rbIter;
  RigidBody *rb;
  AtomIterator aj;
  AtomIterator ai;
  Atom *atom2;
  Atom *atom1;
  Atom *atom;
  set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_> rigidAtoms;
  RigidBody *in_stack_fffffffffffffbf8;
  set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>
  *in_stack_fffffffffffffc00;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_fffffffffffffc08;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_fffffffffffffc10;
  iterator *in_stack_fffffffffffffc18;
  Molecule *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc38;
  string *S;
  AtomType *in_stack_fffffffffffffc78;
  string local_2c0 [32];
  string local_2a0 [32];
  undefined1 local_280 [64];
  string local_240 [32];
  string local_220;
  pointer local_200;
  pointer local_1f8;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_170;
  undefined1 local_158 [32];
  AtomType *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_130;
  string local_120 [32];
  string local_100 [32];
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_e0;
  AtomType *local_c8;
  RigidBody *local_c0;
  Atom *local_b8;
  _Self local_b0;
  _Self local_a8;
  Atom **local_a0;
  Atom **local_98;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_80;
  Bond *local_78;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_70;
  RigidBody *local_68;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_60;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_58;
  Atom *local_50;
  Atom *local_48;
  Atom *local_40;
  
  std::set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>::set
            ((set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_> *)
             0x27491c);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_60);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_70);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_80);
  local_68 = beginRigidBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  while (local_68 != (RigidBody *)0x0) {
    local_98 = (Atom **)RigidBody::getBeginAtomIter(in_stack_fffffffffffffbf8);
    local_a0 = (Atom **)RigidBody::getEndAtomIter(in_stack_fffffffffffffbf8);
    std::set<OpenMD::Atom*,std::less<OpenMD::Atom*>,std::allocator<OpenMD::Atom*>>::
    insert<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    local_68 = nextRigidBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  }
  local_40 = beginAtom(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  while (local_40 != (Atom *)0x0) {
    local_a8._M_node =
         (_Base_ptr)
         std::set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>::find
                   ((set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>
                     *)in_stack_fffffffffffffc08._M_current,(key_type *)in_stack_fffffffffffffc00);
    local_b0._M_node =
         (_Base_ptr)
         std::set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>::end
                   ((set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>
                     *)in_stack_fffffffffffffbf8);
    bVar1 = std::operator==(&local_a8,&local_b0);
    if (bVar1) {
      local_b8 = local_40;
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
    }
    local_40 = nextAtom(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  }
  local_68 = beginRigidBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  while (local_68 != (RigidBody *)0x0) {
    local_c0 = local_68;
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
              ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
               in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
    local_68 = nextRigidBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  }
  local_40 = beginAtom(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  while (local_40 != (Atom *)0x0) {
    bVar1 = Atom::isFluctuatingCharge((Atom *)0x274c37);
    if (bVar1) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 in_stack_fffffffffffffc10._M_current,in_stack_fffffffffffffc08._M_current);
    }
    local_40 = nextAtom(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  }
  local_40 = beginAtom(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  while (local_40 != (Atom *)0x0) {
    local_c8 = Atom::getAtomType(local_40);
    AtomType::allYourBase(in_stack_fffffffffffffc78);
    sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size(&local_e0);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
              (&local_e0,sVar3 - 1);
    AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffbf8);
    UpperCase(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string(local_120);
    iVar2 = std::__cxx11::string::compare((char *)local_100);
    if (((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_100), iVar2 == 0)) ||
       (iVar2 = std::__cxx11::string::compare((char *)local_100), iVar2 == 0)) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 in_stack_fffffffffffffc10._M_current,in_stack_fffffffffffffc08._M_current);
    }
    std::__cxx11::string::~string(local_100);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffc10._M_current);
    local_40 = nextAtom(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  }
  local_78 = beginBond(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  while (local_78 != (Bond *)0x0) {
    local_130._8_8_ = Bond::getAtomA((Bond *)0x274ef2);
    local_130._M_allocated_capacity = (size_type)Bond::getAtomB((Bond *)0x274f19);
    local_138 = Atom::getAtomType((Atom *)local_130._8_8_);
    local_158._24_8_ = Atom::getAtomType((Atom *)local_130._M_allocated_capacity);
    AtomType::allYourBase(in_stack_fffffffffffffc78);
    AtomType::allYourBase(in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = (AtomType *)local_158;
    sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                      ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                       in_stack_fffffffffffffc78);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffc78,sVar3 - 1);
    AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffbf8);
    UpperCase(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string(local_1b0);
    sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size(&local_170);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
              (&local_170,sVar3 - 1);
    AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffbf8);
    UpperCase(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string(local_1f0);
    iVar2 = std::__cxx11::string::compare((char *)local_190);
    if ((iVar2 == 0) &&
       (((iVar2 = std::__cxx11::string::compare((char *)local_1d0), iVar2 == 0 ||
         (iVar2 = std::__cxx11::string::compare((char *)local_1d0), iVar2 == 0)) ||
        (iVar2 = std::__cxx11::string::compare((char *)local_1d0), iVar2 == 0)))) {
      local_1f8 = (pointer)operator_new(0x10);
      *local_1f8 = (RigidBody *)0x0;
      local_1f8[1] = (RigidBody *)0x0;
      *local_1f8 = (RigidBody *)local_130._M_allocated_capacity;
      local_1f8[1] = (RigidBody *)local_130._8_8_;
      std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>::
      push_back((vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 *)in_stack_fffffffffffffc10._M_current,
                (value_type *)in_stack_fffffffffffffc08._M_current);
    }
    iVar2 = std::__cxx11::string::compare((char *)local_1d0);
    if ((iVar2 == 0) &&
       (((iVar2 = std::__cxx11::string::compare((char *)local_190), iVar2 == 0 ||
         (iVar2 = std::__cxx11::string::compare((char *)local_190), iVar2 == 0)) ||
        (iVar2 = std::__cxx11::string::compare((char *)local_190), iVar2 == 0)))) {
      local_200 = (pointer)operator_new(0x10);
      *local_200 = (Inversion *)0x0;
      local_200[1] = (Inversion *)0x0;
      *local_200 = (Inversion *)local_130._8_8_;
      local_200[1] = (Inversion *)local_130._M_allocated_capacity;
      std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>::
      push_back((vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 *)in_stack_fffffffffffffc10._M_current,
                (value_type *)in_stack_fffffffffffffc08._M_current);
    }
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_190);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffc10._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffc10._M_current);
    local_78 = nextBond(in_stack_fffffffffffffc20,(iterator *)in_stack_fffffffffffffc18);
  }
  local_68 = beginRigidBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  while (local_68 != (RigidBody *)0x0) {
    local_48 = RigidBody::beginAtom
                         ((RigidBody *)in_stack_fffffffffffffc20,
                          (iterator *)in_stack_fffffffffffffc18);
    while (local_48 != (Atom *)0x0) {
      local_220.field_2._8_8_ = Atom::getAtomType(local_48);
      AtomType::allYourBase(in_stack_fffffffffffffc78);
      S = &local_220;
      sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                        ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)S);
      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)S,sVar3 - 1);
      AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffbf8);
      UpperCase(S);
      std::__cxx11::string::~string((string *)(local_280 + 0x20));
      iVar2 = std::__cxx11::string::compare((char *)local_240);
      if (((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_240), iVar2 == 0))
         || (iVar2 = std::__cxx11::string::compare((char *)local_240), iVar2 == 0)) {
        local_50 = RigidBody::beginAtom
                             ((RigidBody *)in_stack_fffffffffffffc20,
                              (iterator *)in_stack_fffffffffffffc18);
        while (local_50 != (Atom *)0x0) {
          local_280._24_8_ = Atom::getAtomType(local_50);
          AtomType::allYourBase(in_stack_fffffffffffffc78);
          in_stack_fffffffffffffc20 = (Molecule *)local_280;
          sVar3 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                             in_stack_fffffffffffffc20);
          std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                    ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                     in_stack_fffffffffffffc20,sVar3 - 1);
          AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffbf8);
          UpperCase(S);
          std::__cxx11::string::~string(local_2c0);
          iVar2 = std::__cxx11::string::compare((char *)local_2a0);
          if (iVar2 == 0) {
            in_stack_fffffffffffffc18 = (iterator *)operator_new(0x10);
            in_stack_fffffffffffffc18->_M_current = (RigidBody **)0x0;
            in_stack_fffffffffffffc18[1]._M_current = (RigidBody **)0x0;
            in_stack_fffffffffffffc18->_M_current = (RigidBody **)local_48;
            in_stack_fffffffffffffc18[1]._M_current = (RigidBody **)local_50;
            std::
            vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ::push_back((vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                         *)in_stack_fffffffffffffc10._M_current,
                        (value_type *)in_stack_fffffffffffffc08._M_current);
          }
          std::__cxx11::string::~string(local_2a0);
          std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
                    ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                     in_stack_fffffffffffffc10._M_current);
          in_stack_fffffffffffffc10._M_current =
               (Atom **)RigidBody::nextAtom((RigidBody *)in_stack_fffffffffffffc20,
                                            (iterator *)in_stack_fffffffffffffc18);
          local_50 = (Atom *)in_stack_fffffffffffffc10._M_current;
        }
      }
      std::__cxx11::string::~string(local_240);
      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                 in_stack_fffffffffffffc10._M_current);
      in_stack_fffffffffffffc08._M_current =
           (Atom **)RigidBody::nextAtom((RigidBody *)in_stack_fffffffffffffc20,
                                        (iterator *)in_stack_fffffffffffffc18);
      local_48 = (Atom *)in_stack_fffffffffffffc08._M_current;
    }
    local_68 = nextRigidBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  }
  std::set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>::~set
            ((set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_> *)
             0x2757b4);
  return;
}

Assistant:

void Molecule::complete() {
    std::set<Atom*> rigidAtoms;
    Atom* atom;
    Atom* atom1;
    Atom* atom2;
    AtomIterator ai, aj;
    RigidBody* rb;
    RigidBodyIterator rbIter;
    Bond* bond;
    BondIterator bi;

    // Get list of all the atoms that are part of rigid bodies

    for (rb = beginRigidBody(rbIter); rb != NULL; rb = nextRigidBody(rbIter)) {
      rigidAtoms.insert(rb->getBeginAtomIter(), rb->getEndAtomIter());
    }

    // add any atom that wasn't part of a rigid body to the list of
    // integrableObjects

    for (atom = beginAtom(ai); atom != NULL; atom = nextAtom(ai)) {
      if (rigidAtoms.find(atom) == rigidAtoms.end()) {
        // If an atom does not belong to a rigid body, it is an
        // integrable object

        integrableObjects_.push_back(atom);
      }
    }

    // then add the rigid bodies themselves to the integrableObjects

    for (rb = beginRigidBody(rbIter); rb != NULL; rb = nextRigidBody(rbIter)) {
      integrableObjects_.push_back(rb);
    }

    // find the atoms that are fluctuating charges and add them to the
    // fluctuatingCharges_ vector

    for (atom = beginAtom(ai); atom != NULL; atom = nextAtom(ai)) {
      if (atom->isFluctuatingCharge()) fluctuatingCharges_.push_back(atom);
    }

    // find the electronegative atoms and add them to the
    // hBondAcceptors_ vector:

    for (atom = beginAtom(ai); atom != NULL; atom = nextAtom(ai)) {
      AtomType* at = atom->getAtomType();
      // get the chain of base types for this atom type:
      std::vector<AtomType*> ayb = at->allYourBase();
      // use the last type in the chain of base types for the name:
      std::string bn = UpperCase(ayb[ayb.size() - 1]->getName());

      if (bn.compare("O") == 0 || bn.compare("N") == 0 || bn.compare("F") == 0)
        hBondAcceptors_.push_back(atom);
    }

    // find electronegative atoms that are either bonded to
    // hydrogens or are present in the same rigid bodies:

    for (bond = beginBond(bi); bond != NULL; bond = nextBond(bi)) {
      Atom* atom1   = bond->getAtomA();
      Atom* atom2   = bond->getAtomB();
      AtomType* at1 = atom1->getAtomType();
      AtomType* at2 = atom2->getAtomType();
      // get the chain of base types for this atom type:
      std::vector<AtomType*> ayb1 = at1->allYourBase();
      std::vector<AtomType*> ayb2 = at2->allYourBase();
      // use the last type in the chain of base types for the name:
      std::string bn1 = UpperCase(ayb1[ayb1.size() - 1]->getName());
      std::string bn2 = UpperCase(ayb2[ayb2.size() - 1]->getName());

      if (bn1.compare("H") == 0) {
        if (bn2.compare("O") == 0 || bn2.compare("N") == 0 ||
            bn2.compare("F") == 0) {
          HBondDonor* donor      = new HBondDonor();
          donor->donorAtom       = atom2;
          donor->donatedHydrogen = atom1;
          hBondDonors_.push_back(donor);
        }
      }
      if (bn2.compare("H") == 0) {
        if (bn1.compare("O") == 0 || bn1.compare("N") == 0 ||
            bn1.compare("F") == 0) {
          HBondDonor* donor      = new HBondDonor();
          donor->donorAtom       = atom1;
          donor->donatedHydrogen = atom2;
          hBondDonors_.push_back(donor);
        }
      }
    }

    for (rb = beginRigidBody(rbIter); rb != NULL; rb = nextRigidBody(rbIter)) {
      for (atom1 = rb->beginAtom(ai); atom1 != NULL; atom1 = rb->nextAtom(ai)) {
        AtomType* at1 = atom1->getAtomType();
        // get the chain of base types for this atom type:
        std::vector<AtomType*> ayb1 = at1->allYourBase();
        // use the last type in the chain of base types for the name:
        std::string bn1 = UpperCase(ayb1[ayb1.size() - 1]->getName());

        if (bn1.compare("O") == 0 || bn1.compare("N") == 0 ||
            bn1.compare("F") == 0) {
          for (atom2 = rb->beginAtom(aj); atom2 != NULL;
               atom2 = rb->nextAtom(aj)) {
            AtomType* at2 = atom2->getAtomType();
            // get the chain of base types for this atom type:
            std::vector<AtomType*> ayb2 = at2->allYourBase();
            // use the last type in the chain of base types for the name:
            std::string bn2 = UpperCase(ayb2[ayb2.size() - 1]->getName());
            if (bn2.compare("H") == 0) {
              HBondDonor* donor      = new HBondDonor();
              donor->donorAtom       = atom1;
              donor->donatedHydrogen = atom2;
              hBondDonors_.push_back(donor);
            }
          }
        }
      }
    }
  }